

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::adopt
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,
               OrphanBuilder *value)

{
  SegmentBuilder *srcSegment;
  BuilderArena *pBVar1;
  BuilderArena *pBVar2;
  WirePointer *pWVar3;
  bool bVar4;
  Fault local_30;
  Fault f;
  OrphanBuilder *value_local;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  bVar4 = true;
  f.exception = (Exception *)value;
  if (value->segment != (SegmentBuilder *)0x0) {
    pBVar1 = SegmentBuilder::getArena(value->segment);
    pBVar2 = SegmentBuilder::getArena(segment);
    bVar4 = pBVar1 == pBVar2;
  }
  if (bVar4) {
    bVar4 = WirePointer::isNull(ref);
    if (!bVar4) {
      zeroObject(segment,capTable,ref);
    }
    bVar4 = OrphanBuilder::operator==((OrphanBuilder *)f.exception,(void *)0x0);
    if (bVar4) {
      zeroMemory(ref);
    }
    else {
      pWVar3 = OrphanBuilder::tagAsPtr((OrphanBuilder *)f.exception);
      bVar4 = WirePointer::isPositional(pWVar3);
      if (bVar4) {
        srcSegment = (SegmentBuilder *)((f.exception)->ownFile).content.size_;
        pWVar3 = OrphanBuilder::tagAsPtr((OrphanBuilder *)f.exception);
        transferPointer(segment,ref,srcSegment,pWVar3,(word *)(f.exception)->file);
      }
      else {
        pWVar3 = OrphanBuilder::tagAsPtr((OrphanBuilder *)f.exception);
        copyMemory<capnp::_::WirePointer>(ref,pWVar3);
      }
    }
    pWVar3 = OrphanBuilder::tagAsPtr((OrphanBuilder *)f.exception);
    zeroMemory(pWVar3);
    (f.exception)->file = (char *)0x0;
    ((f.exception)->ownFile).content.size_ = 0;
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0x822,FAILED,
             "value.segment == nullptr || value.segment->getArena() == segment->getArena()",
             "\"Adopted object must live in the same message.\"",
             (char (*) [46])"Adopted object must live in the same message.");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

static void adopt(SegmentBuilder* segment, CapTableBuilder* capTable,
                    WirePointer* ref, OrphanBuilder&& value) {
    KJ_REQUIRE(value.segment == nullptr || value.segment->getArena() == segment->getArena(),
               "Adopted object must live in the same message.");

    if (!ref->isNull()) {
      zeroObject(segment, capTable, ref);
    }

    if (value == nullptr) {
      // Set null.
      zeroMemory(ref);
    } else if (value.tagAsPtr()->isPositional()) {
      WireHelpers::transferPointer(segment, ref, value.segment, value.tagAsPtr(), value.location);
    } else {
      // FAR and OTHER pointers are position-independent, so we can just copy.
      copyMemory(ref, value.tagAsPtr());
    }

    // Take ownership away from the OrphanBuilder.
    zeroMemory(value.tagAsPtr());
    value.location = nullptr;
    value.segment = nullptr;
  }